

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O0

void util::from_utf8(string *from,string *to,codepage_id codepage)

{
  bool bVar1;
  ulong uVar2;
  logger *this;
  codepage_id in_EDX;
  string *in_RSI;
  string *in_RDI;
  string *in_stack_00000028;
  string *in_stack_00000030;
  string *in_stack_fffffffffffffe48;
  char (*i) [10];
  logger *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe5c;
  string *in_stack_fffffffffffffe60;
  char local_198 [16];
  string *in_stack_fffffffffffffe78;
  logger *in_stack_ffffffffffffff80;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    if ((in_EDX == 0xfde9) ||
       ((bVar1 = anon_unknown_0::is_extended_ascii(in_EDX), bVar1 &&
        (bVar1 = anon_unknown_0::is_ascii(in_stack_fffffffffffffe78), bVar1)))) {
      std::__cxx11::string::operator=(in_RSI,in_RDI);
    }
    else if (in_EDX == 0x4b0) {
      wtf8_to_utf16le(in_stack_fffffffffffffe60,(string *)CONCAT44(in_stack_fffffffffffffe5c,0x4b0))
      ;
    }
    else if (in_EDX == 0x4e4) {
      anon_unknown_0::utf8_to_windows1252(in_stack_00000030,in_stack_00000028);
    }
    else {
      bVar1 = anon_unknown_0::from_utf8_iconv
                        ((string *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,0);
      if (!bVar1) {
        i = (char (*) [10])local_198;
        logger::logger(in_stack_fffffffffffffe50,(log_level)((ulong)i >> 0x20));
        this = logger::operator<<(in_stack_fffffffffffffe50,i);
        logger::operator<<(this,(uint *)i);
        logger::~logger(in_stack_ffffffffffffff80);
        std::__cxx11::string::operator=(in_RSI,in_RDI);
      }
    }
  }
  else {
    std::__cxx11::string::clear();
  }
  return;
}

Assistant:

void from_utf8(const std::string & from, std::string & to, codepage_id codepage) {
	
	if(from.empty()) {
		to.clear();
		return;
	}
	
	if(codepage == cp_utf8 || (is_extended_ascii(codepage) && is_ascii(from))) {
		to = from;
		return;
	}
	
	switch(codepage) {
		case cp_utf16le:     wtf8_to_utf16le(from, to); return;
		case cp_windows1252: utf8_to_windows1252(from, to); return;
		default: break;
	}
	
	#if INNOEXTRACT_HAVE_ICONV
	if(from_utf8_iconv(from, to, codepage)) {
		return;
	}
	#endif
	
	#if INNOEXTRACT_HAVE_WIN32_CONV
	if(from_utf8_win32(from, to, codepage)) {
		return;
	}
	#endif
	
	log_warning << "Unsupported output codepage: " << codepage;
	to = from;
	
}